

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_connect_to_host_port
                   (Curl_easy *data,char *host,char **hostname_result,int *port_result)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  long portparse;
  char *endp;
  char *ptr;
  CURLcode result;
  int port;
  char *portptr;
  char *host_portno;
  char *hostptr;
  char *host_dup;
  int *port_result_local;
  char **hostname_result_local;
  char *host_local;
  Curl_easy *data_local;
  
  ptr._4_4_ = 0xffffffff;
  ptr._0_4_ = CURLE_OK;
  *hostname_result = (char *)0x0;
  *port_result = -1;
  if ((host == (char *)0x0) || (*host == '\0')) {
    return CURLE_OK;
  }
  host_dup = (char *)port_result;
  port_result_local = (int *)hostname_result;
  hostname_result_local = (char **)host;
  host_local = (char *)data;
  _result = (*Curl_cstrdup)(host);
  if (_result == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  host_portno = _result;
  hostptr = _result;
  if (*_result == '[') {
    host_portno = _result + 1;
    endp = host_portno;
    while( true ) {
      bVar4 = false;
      if ((((*endp != '\0') && ((*endp < '0' || (bVar4 = true, '9' < *endp)))) &&
          ((*endp < 'a' || (bVar4 = true, 'f' < *endp)))) &&
         (((*endp < 'A' || (bVar4 = true, 'F' < *endp)) && (bVar4 = true, *endp != ':')))) {
        bVar4 = *endp == '.';
      }
      if (!bVar4) break;
      endp = endp + 1;
    }
    if (*endp == '%') {
      iVar1 = strncmp("%25",endp,3);
      if (((iVar1 != 0) && (host_local != (char *)0x0)) &&
         ((*(ulong *)(host_local + 0xa52) >> 0x1c & 1) != 0)) {
        Curl_infof((Curl_easy *)host_local,"Please URL encode %% as %%25, see RFC 6874.");
      }
      do {
        endp = endp + 1;
        bVar4 = false;
        if (((*endp != '\0') && ((*endp < 'a' || (bVar4 = true, 'z' < *endp)))) &&
           (((*endp < 'A' || (bVar4 = true, 'Z' < *endp)) &&
            (((*endp < '0' || (bVar4 = true, '9' < *endp)) &&
             (((*endp < 'a' || (bVar4 = true, 'f' < *endp)) &&
              ((((*endp < 'A' || (bVar4 = true, 'F' < *endp)) && (bVar4 = true, *endp != '-')) &&
               ((bVar4 = true, *endp != '.' && (bVar4 = true, *endp != '_')))))))))))) {
          bVar4 = *endp == '~';
        }
      } while (bVar4);
    }
    if (*endp == ']') {
      *endp = '\0';
      endp = endp + 1;
    }
    else if ((host_local != (char *)0x0) && ((*(ulong *)(host_local + 0xa52) >> 0x1c & 1) != 0)) {
      Curl_infof((Curl_easy *)host_local,"Invalid IPv6 address format");
    }
    _result = endp;
  }
  portptr = strchr(_result,0x3a);
  if (portptr != (char *)0x0) {
    portparse = 0;
    *portptr = '\0';
    portptr = portptr + 1;
    if (*portptr != '\0') {
      lVar2 = strtol(portptr,(char **)&portparse,10);
      if ((((portparse != 0) && (*(char *)portparse != '\0')) || (lVar2 < 0)) || (0xffff < lVar2)) {
        Curl_failf((Curl_easy *)host_local,"No valid port number in connect to host string (%s)",
                   portptr);
        ptr._0_4_ = CURLE_SETOPT_OPTION_SYNTAX;
        goto LAB_00bd3305;
      }
      ptr._4_4_ = (undefined4)lVar2;
    }
  }
  pcVar3 = (*Curl_cstrdup)(host_portno);
  *(char **)port_result_local = pcVar3;
  if (*(long *)port_result_local == 0) {
    ptr._0_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    *(undefined4 *)host_dup = ptr._4_4_;
  }
LAB_00bd3305:
  (*Curl_cfree)(hostptr);
  return (CURLcode)ptr;
}

Assistant:

static CURLcode parse_connect_to_host_port(struct Curl_easy *data,
                                           const char *host,
                                           char **hostname_result,
                                           int *port_result)
{
  char *host_dup;
  char *hostptr;
  char *host_portno;
  char *portptr;
  int port = -1;
  CURLcode result = CURLE_OK;

#if defined(CURL_DISABLE_VERBOSE_STRINGS)
  (void) data;
#endif

  *hostname_result = NULL;
  *port_result = -1;

  if(!host || !*host)
    return CURLE_OK;

  host_dup = strdup(host);
  if(!host_dup)
    return CURLE_OUT_OF_MEMORY;

  hostptr = host_dup;

  /* start scanning for port number at this point */
  portptr = hostptr;

  /* detect and extract RFC6874-style IPv6-addresses */
  if(*hostptr == '[') {
#ifdef ENABLE_IPV6
    char *ptr = ++hostptr; /* advance beyond the initial bracket */
    while(*ptr && (ISXDIGIT(*ptr) || (*ptr == ':') || (*ptr == '.')))
      ptr++;
    if(*ptr == '%') {
      /* There might be a zone identifier */
      if(strncmp("%25", ptr, 3))
        infof(data, "Please URL encode %% as %%25, see RFC 6874.");
      ptr++;
      /* Allow unreserved characters as defined in RFC 3986 */
      while(*ptr && (ISALPHA(*ptr) || ISXDIGIT(*ptr) || (*ptr == '-') ||
                     (*ptr == '.') || (*ptr == '_') || (*ptr == '~')))
        ptr++;
    }
    if(*ptr == ']')
      /* yeps, it ended nicely with a bracket as well */
      *ptr++ = '\0';
    else
      infof(data, "Invalid IPv6 address format");
    portptr = ptr;
    /* Note that if this didn't end with a bracket, we still advanced the
     * hostptr first, but I can't see anything wrong with that as no host
     * name nor a numeric can legally start with a bracket.
     */
#else
    failf(data, "Use of IPv6 in *_CONNECT_TO without IPv6 support built-in");
    result = CURLE_NOT_BUILT_IN;
    goto error;
#endif
  }

  /* Get port number off server.com:1080 */
  host_portno = strchr(portptr, ':');
  if(host_portno) {
    char *endp = NULL;
    *host_portno = '\0'; /* cut off number from host name */
    host_portno++;
    if(*host_portno) {
      long portparse = strtol(host_portno, &endp, 10);
      if((endp && *endp) || (portparse < 0) || (portparse > 65535)) {
        failf(data, "No valid port number in connect to host string (%s)",
              host_portno);
        result = CURLE_SETOPT_OPTION_SYNTAX;
        goto error;
      }
      else
        port = (int)portparse; /* we know it will fit */
    }
  }

  /* now, clone the cleaned host name */
  DEBUGASSERT(hostptr);
  *hostname_result = strdup(hostptr);
  if(!*hostname_result) {
    result = CURLE_OUT_OF_MEMORY;
    goto error;
  }

  *port_result = port;

error:
  free(host_dup);
  return result;
}